

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::CEscape(string *src)

{
  string *in_RDI;
  string *in_stack_00000010;
  StringPiece in_stack_00000018;
  string *dest;
  string *this;
  
  this = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  StringPiece::StringPiece<std::allocator<char>>((StringPiece *)this,in_RDI);
  CEscapeAndAppend(in_stack_00000018,in_stack_00000010);
  return this;
}

Assistant:

std::string CEscape(const std::string &src) {
  std::string dest;
  CEscapeAndAppend(src, &dest);
  return dest;
}